

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctcl__del(fctcl_t *clo)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    free((void *)*in_RDI);
    free((void *)in_RDI[1]);
    free((void *)in_RDI[4]);
    free((void *)in_RDI[3]);
    free(in_RDI);
  }
  return;
}

Assistant:

static void
fctcl__del(fctcl_t *clo)
{
    if ( clo == NULL )
    {
        return;
    }
    free(clo->long_opt);
    free(clo->short_opt);
    free(clo->value);
    free(clo->help);
    free(clo);
}